

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

AST_NodePtr __thiscall
chaiscript::ChaiScript_Basic::parse(ChaiScript_Basic *this,string *t_input,bool t_debug_print)

{
  undefined8 *puVar1;
  long *plVar2;
  _func_int **pp_Var3;
  char in_CL;
  undefined7 in_register_00000011;
  pointer *__ptr;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  puVar1 = (undefined8 *)t_input[9]._M_string_length;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"PARSE","");
  (**(code **)*puVar1)(this,puVar1,CONCAT71(in_register_00000011,t_debug_print),local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (in_CL != '\0') {
    plVar2 = (long *)t_input[9]._M_string_length;
    pp_Var3 = this->_vptr_ChaiScript_Basic;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    (**(code **)(*plVar2 + 8))(plVar2,pp_Var3,local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  return (__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
          )(__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
            )this;
}

Assistant:

AST_NodePtr parse(const std::string &t_input, const bool t_debug_print = false) {
      auto ast = m_parser->parse(t_input, "PARSE");
      if (t_debug_print) {
        m_parser->debug_print(*ast);
      }
      return ast;
    }